

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateSwap
          (MessageGenerator *this,Printer *printer)

{
  uint uVar1;
  Printer *this_00;
  bool bVar2;
  int iVar3;
  int iVar4;
  FileDescriptor *pFVar5;
  FieldGenerator *pFVar6;
  string local_50;
  uint local_2c;
  FieldDescriptor *pFStack_28;
  int i_1;
  FieldDescriptor *field;
  Printer *pPStack_18;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  io::Printer::Print(printer,"void $classname$::Swap($classname$* other) {\n","classname",
                     &this->classname_);
  io::Printer::Indent(pPStack_18);
  io::Printer::Print(pPStack_18,"if (other != this) {\n");
  io::Printer::Indent(pPStack_18);
  pFVar5 = Descriptor::file(this->descriptor_);
  bVar2 = HasGeneratedMethods(pFVar5);
  if (bVar2) {
    for (field._4_4_ = 0; iVar4 = field._4_4_, iVar3 = Descriptor::field_count(this->descriptor_),
        iVar4 < iVar3; field._4_4_ = field._4_4_ + 1) {
      pFStack_28 = Descriptor::field(this->descriptor_,field._4_4_);
      pFVar6 = FieldGeneratorMap::get(&this->field_generators_,pFStack_28);
      (*pFVar6->_vptr_FieldGenerator[8])(pFVar6,pPStack_18);
    }
    local_2c = 0;
    while( true ) {
      uVar1 = local_2c;
      iVar4 = Descriptor::field_count(this->descriptor_);
      this_00 = pPStack_18;
      if ((iVar4 + 0x1f) / 0x20 <= (int)uVar1) break;
      SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)local_2c,(iVar4 + 0x1f) % 0x20);
      io::Printer::Print(this_00,"std::swap(_has_bits_[$i$], other->_has_bits_[$i$]);\n","i",
                         &local_50);
      std::__cxx11::string::~string((string *)&local_50);
      local_2c = local_2c + 1;
    }
    pFVar5 = Descriptor::file(this->descriptor_);
    bVar2 = HasUnknownFields(pFVar5);
    if (bVar2) {
      io::Printer::Print(pPStack_18,"_unknown_fields_.Swap(&other->_unknown_fields_);\n");
    }
    io::Printer::Print(pPStack_18,"std::swap(_cached_size_, other->_cached_size_);\n");
    iVar4 = Descriptor::extension_range_count(this->descriptor_);
    if (0 < iVar4) {
      io::Printer::Print(pPStack_18,"_extensions_.Swap(&other->_extensions_);\n");
    }
  }
  else {
    io::Printer::Print(pPStack_18,"GetReflection()->Swap(this, other);");
  }
  io::Printer::Outdent(pPStack_18);
  io::Printer::Print(pPStack_18,"}\n");
  io::Printer::Outdent(pPStack_18);
  io::Printer::Print(pPStack_18,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateSwap(io::Printer* printer) {
  // Generate the Swap member function.
  printer->Print("void $classname$::Swap($classname$* other) {\n",
                 "classname", classname_);
  printer->Indent();
  printer->Print("if (other != this) {\n");
  printer->Indent();

  if (HasGeneratedMethods(descriptor_->file())) {
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = descriptor_->field(i);
      field_generators_.get(field).GenerateSwappingCode(printer);
    }

    for (int i = 0; i < (descriptor_->field_count() + 31) / 32; ++i) {
      printer->Print("std::swap(_has_bits_[$i$], other->_has_bits_[$i$]);\n",
                     "i", SimpleItoa(i));
    }

    if (HasUnknownFields(descriptor_->file())) {
      printer->Print("_unknown_fields_.Swap(&other->_unknown_fields_);\n");
    }
    printer->Print("std::swap(_cached_size_, other->_cached_size_);\n");
    if (descriptor_->extension_range_count() > 0) {
      printer->Print("_extensions_.Swap(&other->_extensions_);\n");
    }
  } else {
    printer->Print("GetReflection()->Swap(this, other);");
  }

  printer->Outdent();
  printer->Print("}\n");
  printer->Outdent();
  printer->Print("}\n");
}